

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crit.hpp
# Opt level: O0

double eval_guided_crit_weighted<double,unsigned_long,std::vector<double,std::allocator<double>>,double>
                 (size_t *ix_arr,size_t st,size_t end,size_t col_num,double *Xc,
                 unsigned_long *Xc_ind,unsigned_long *Xc_indptr,double *buffer_arr,
                 size_t *buffer_pos,bool as_relative_gain,double *saved_xmedian,double *split_point,
                 double *xmin,double *xmax,GainCriterion criterion,double min_gain,
                 MissingAction missing_action,size_t *cols_use,size_t ncols_use,bool force_cols_use,
                 double *X_row_major,size_t ncols,double *Xr,size_t *Xr_ind,size_t *Xr_indptr,
                 vector<double,_std::allocator<double>_> *w)

{
  unsigned_long uVar1;
  value_type vVar2;
  uint uVar3;
  int iVar4;
  unsigned_long *puVar5;
  reference pvVar6;
  ulong in_RDX;
  double unaff_RBP;
  ulong in_RSI;
  long in_RDI;
  undefined8 unaff_R15;
  double dVar7;
  undefined1 auVar8 [16];
  undefined1 unaff_retaddr;
  double *in_stack_00000008;
  double *in_stack_00000010;
  unsigned_long *in_stack_00000018;
  byte in_stack_00000020;
  undefined7 in_stack_00000021;
  double *in_stack_00000028;
  vector<double,_std::allocator<double>_> *in_stack_00000030;
  int in_stack_00000050;
  byte in_stack_00000068;
  double *in_stack_00000070;
  double *in_stack_00000078;
  size_t *in_stack_00000080;
  double *in_stack_00000088;
  double *in_stack_00000090;
  vector<double,_std::allocator<double>_> *in_stack_00000098;
  GainCriterion in_stack_000000a0;
  MissingAction in_stack_000000a8;
  size_t *in_stack_000000b0;
  size_t in_stack_000000b8;
  double *in_stack_000000c8;
  size_t in_stack_000000d0;
  double *in_stack_000000d8;
  size_t *in_stack_000000e0;
  size_t *in_stack_000000e8;
  vector<double,_std::allocator<double>_> *in_stack_000000f0;
  size_t row;
  vector<double,_std::allocator<double>_> buffer_w;
  size_t ix_1;
  double xlow;
  size_t idx_half;
  size_t ix;
  size_t tot;
  size_t ignored;
  unsigned_long *in_stack_fffffffffffffe18;
  allocator_type *in_stack_fffffffffffffe20;
  size_type in_stack_fffffffffffffe28;
  vector<double,_std::allocator<double>_> *in_stack_fffffffffffffe30;
  undefined4 in_stack_fffffffffffffe38;
  undefined4 in_stack_fffffffffffffe3c;
  undefined4 in_stack_fffffffffffffe40;
  undefined4 in_stack_fffffffffffffe44;
  unsigned_long *in_stack_fffffffffffffe48;
  anon_class_8_1_0f1c67a0 in_stack_fffffffffffffe50;
  undefined4 in_stack_fffffffffffffe58;
  undefined4 in_stack_fffffffffffffe5c;
  size_t in_stack_fffffffffffffe60;
  size_t in_stack_fffffffffffffe68;
  size_t *in_stack_fffffffffffffe70;
  unsigned_long *in_stack_fffffffffffffe80;
  double *in_stack_fffffffffffffe88;
  double local_110;
  byte local_101;
  ulong local_e8;
  vector<double,_std::allocator<double>_> local_c8;
  ulong local_b0;
  double local_a8;
  undefined8 *local_a0;
  ulong local_98;
  ulong local_90;
  ulong local_88;
  byte local_71;
  byte local_61;
  ulong local_48;
  ulong local_40;
  long local_38;
  
  local_61 = in_stack_00000020 & 1;
  local_71 = in_stack_00000068 & 1;
  local_48 = in_RDX;
  local_40 = in_RSI;
  local_38 = in_RDI;
  todense<double,unsigned_long>
            (in_stack_fffffffffffffe70,in_stack_fffffffffffffe68,in_stack_fffffffffffffe60,
             CONCAT44(in_stack_fffffffffffffe5c,in_stack_fffffffffffffe58),
             (double *)in_stack_fffffffffffffe50.buffer_arr,in_stack_fffffffffffffe48,
             in_stack_fffffffffffffe80,in_stack_fffffffffffffe88);
  local_88 = (local_48 - local_40) + 1;
  std::iota<unsigned_long*,unsigned_long>(in_stack_00000018,in_stack_00000018 + local_88,0);
  if (in_stack_00000050 == 0x16) {
    for (local_90 = 0; local_90 < local_88; local_90 = local_90 + 1) {
      uVar3 = std::isnan(in_stack_00000010[local_90]);
      local_101 = 1;
      if ((uVar3 & 1) == 0) {
        iVar4 = std::isinf(in_stack_00000010[local_90]);
        local_101 = (byte)iVar4;
      }
      if ((local_101 & 1) != 0) {
        local_98 = local_88 >> 1;
        local_a0 = &stack0x00000010;
        std::
        nth_element<unsigned_long*,eval_guided_crit_weighted<double,unsigned_long,std::vector<double,std::allocator<double>>,double>(unsigned_long*,unsigned_long,unsigned_long,unsigned_long,double*,unsigned_long*,unsigned_long*,double*,unsigned_long*,bool,double*,double&,double&,double&,GainCriterion,double,MissingAction,unsigned_long*,unsigned_long,bool,double*,unsigned_long,double*,unsigned_long*,unsigned_long*,std::vector<double,std::allocator<double>>&)::_lambda(unsigned_long,unsigned_long)_1_>
                  (in_stack_fffffffffffffe48,
                   (unsigned_long *)CONCAT44(in_stack_fffffffffffffe44,in_stack_fffffffffffffe40),
                   (unsigned_long *)CONCAT44(in_stack_fffffffffffffe3c,in_stack_fffffffffffffe38),
                   in_stack_fffffffffffffe50);
        *in_stack_00000028 = in_stack_00000010[in_stack_00000018[local_98]];
        if ((local_88 & 1) == 0) {
          puVar5 = std::max_element<unsigned_long*>
                             ((unsigned_long *)in_stack_fffffffffffffe20,in_stack_fffffffffffffe18);
          uVar1 = *puVar5;
          auVar8._8_4_ = (int)(uVar1 >> 0x20);
          auVar8._0_8_ = uVar1;
          auVar8._12_4_ = 0x45300000;
          local_a8 = (auVar8._8_8_ - 1.9342813113834067e+25) +
                     ((double)CONCAT44(0x43300000,(int)uVar1) - 4503599627370496.0);
          *in_stack_00000028 = local_a8 + (*in_stack_00000028 - local_a8) / 2.0;
        }
        for (local_b0 = 0; local_b0 < local_88; local_b0 = local_b0 + 1) {
          uVar3 = std::isnan(in_stack_00000010[local_b0]);
          if (((uVar3 & 1) == 0) &&
             (uVar3 = std::isinf(in_stack_00000010[local_b0]), (uVar3 & 1) == 0)) {
            local_110 = in_stack_00000010[local_b0];
          }
          else {
            local_110 = *in_stack_00000028;
          }
          in_stack_00000010[local_b0] = local_110;
        }
        std::iota<unsigned_long*,unsigned_long>(in_stack_00000018,in_stack_00000018 + local_88,0);
        break;
      }
    }
  }
  std::allocator<double>::allocator((allocator<double> *)0x3da303);
  std::vector<double,_std::allocator<double>_>::vector
            (in_stack_fffffffffffffe30,in_stack_fffffffffffffe28,in_stack_fffffffffffffe20);
  std::allocator<double>::~allocator((allocator<double> *)0x3da32f);
  for (local_e8 = local_40; local_e8 <= local_48; local_e8 = local_e8 + 1) {
    pvVar6 = std::vector<double,_std::allocator<double>_>::operator[]
                       (in_stack_00000098,*(size_type *)(local_38 + local_e8 * 8));
    vVar2 = *pvVar6;
    pvVar6 = std::vector<double,_std::allocator<double>_>::operator[](&local_c8,local_e8 - local_40)
    ;
    *pvVar6 = vVar2;
  }
  dVar7 = eval_guided_crit_weighted<double,std::vector<double,std::allocator<double>>,double>
                    ((size_t *)in_stack_00000028,CONCAT71(in_stack_00000021,in_stack_00000020),
                     (size_t)in_stack_00000018,in_stack_00000010,in_stack_00000008,
                     (bool)unaff_retaddr,in_stack_00000070,in_stack_00000078,in_stack_00000080,
                     in_stack_00000088,in_stack_00000090,(double *)in_stack_00000098,
                     in_stack_000000a0,unaff_RBP,in_stack_000000a8,in_stack_000000b0,
                     in_stack_000000b8,SUB81((ulong)unaff_R15 >> 0x38,0),in_stack_000000c8,
                     in_stack_000000d0,in_stack_000000d8,in_stack_000000e0,in_stack_000000e8,
                     in_stack_000000f0);
  std::vector<double,_std::allocator<double>_>::~vector(in_stack_00000030);
  return dVar7;
}

Assistant:

double eval_guided_crit_weighted(size_t ix_arr[], size_t st, size_t end,
                                 size_t col_num, real_t_ Xc[], sparse_ix Xc_ind[], sparse_ix Xc_indptr[],
                                 double buffer_arr[], size_t buffer_pos[], bool as_relative_gain,
                                 double *restrict saved_xmedian,
                                 double &restrict split_point, double &restrict xmin, double &restrict xmax,
                                 GainCriterion criterion, double min_gain, MissingAction missing_action,
                                 size_t *restrict cols_use, size_t ncols_use, bool force_cols_use,
                                 double *restrict X_row_major, size_t ncols,
                                 double *restrict Xr, size_t *restrict Xr_ind, size_t *restrict Xr_indptr,
                                 mapping &restrict w)
{
    size_t ignored;


    todense(ix_arr, st, end,
            col_num, Xc, Xc_ind, Xc_indptr,
            buffer_arr);
    size_t tot = end - st + 1;
    std::iota(buffer_pos, buffer_pos + tot, (size_t)0);


    if (missing_action == Impute)
    {
        missing_action = Fail;
        for (size_t ix = 0; ix < tot; ix++)
        {
            if (unlikely(is_na_or_inf(buffer_arr[ix])))
            {
                goto fill_missing;
            }
        }
        goto no_nas;

        fill_missing:
        {
            size_t idx_half = div2(tot);
            std::nth_element(buffer_pos, buffer_pos + idx_half, buffer_pos + tot,
                             [&buffer_arr](const size_t a, const size_t b){return buffer_arr[a] < buffer_arr[b];});
            *saved_xmedian = buffer_arr[buffer_pos[idx_half]];

            if ((tot % 2) == 0)
            {
                double xlow = *std::max_element(buffer_pos, buffer_pos + idx_half);
                *saved_xmedian = xlow + ((*saved_xmedian)-xlow)/2.;
            }

            for (size_t ix = 0; ix < tot; ix++)
                buffer_arr[ix] = is_na_or_inf(buffer_arr[ix])? (*saved_xmedian) : buffer_arr[ix];
            std::iota(buffer_pos, buffer_pos + tot, (size_t)0);
        }
    }


    no_nas:
    /* TODO: allocate this buffer externally */
    std::vector<double> buffer_w(tot);
    for (size_t row = st; row <= end; row++)
        buffer_w[row-st] = w[ix_arr[row]];
    /* TODO: in this case, as the weights match with the order of the indices, could use a faster version
       with a weighted rel_gain function instead (not yet implemented). */
    return eval_guided_crit_weighted<double, std::vector<double>, ldouble_safe>(
                                     buffer_pos, 0, end - st, buffer_arr, buffer_arr + tot,
                                     as_relative_gain, saved_xmedian, (double*)NULL, ignored, split_point,
                                     xmin, xmax, criterion, min_gain, missing_action,
                                     cols_use, ncols_use, force_cols_use,
                                     X_row_major, ncols,
                                     Xr, Xr_ind, Xr_indptr,
                                     buffer_w);
}